

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void finish(bfgs *b)

{
  float *__ptr;
  
  __ptr = (b->predictions)._begin;
  if (__ptr != (float *)0x0) {
    free(__ptr);
  }
  (b->predictions)._begin = (float *)0x0;
  (b->predictions)._end = (float *)0x0;
  (b->predictions).end_array = (float *)0x0;
  free(b->mem);
  free(b->rho);
  free(b->alpha);
  return;
}

Assistant:

void finish(bfgs& b)
{
  b.predictions.delete_v();
  free(b.mem);
  free(b.rho);
  free(b.alpha);
}